

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  IRContext *pIVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> inst;
  pointer puVar2;
  StorageClass storage_class;
  uint32_t uVar3;
  uint32_t res_id;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  TypeManager *this_00;
  Operand *pOVar6;
  Instruction *this_01;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var7;
  undefined1 assert_found_terminating_null;
  long lVar8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *new_name
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *d;
  bool is_old_var_struct;
  IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  IVar9;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> local_198;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_180;
  uint32_t local_178;
  uint local_174;
  Op local_170;
  uint32_t local_16c;
  Instruction *local_168;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_160;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  undefined1 local_138 [48];
  undefined4 local_108 [2];
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_b8 [40];
  SmallVector<unsigned_int,_2UL> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string name_str;
  
  storage_class = Instruction::GetSingleWordInOperand(var,0);
  uVar3 = Instruction::type_id(var);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
  if (pIVar5->opcode_ != OpTypePointer) {
    __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x129,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(pIVar5,1);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  local_168 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
  local_170 = local_168->opcode_;
  if ((local_170 | OpSourceContinued) != OpTypeStruct) {
    __assert_fail("(is_array || is_struct) && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x12f,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  is_old_var_struct = local_170 == OpTypeStruct;
  local_174 = (uint)(local_170 == OpTypeArray);
  uVar3 = idx;
  if (local_170 == OpTypeArray) {
    uVar3 = 0;
  }
  uVar3 = Instruction::GetSingleWordInOperand(local_168,uVar3);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar3 = analysis::TypeManager::FindPointerToType(this_00,uVar3,storage_class);
  local_178 = uVar3;
  res_id = Pass::TakeNextId(&this->super_Pass);
  pIVar5 = (Instruction *)::operator_new(0x70);
  pIVar1 = (this->super_Pass).context_;
  init_list._M_len = 1;
  init_list._M_array = (iterator)&name_str;
  name_str._M_dataplus._M_p._0_4_ = storage_class;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
  local_138._0_4_ = 0x11;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_138 + 8),&local_90);
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_b8,
             local_138,local_108);
  Instruction::Instruction(pIVar5,pIVar1,OpVariable,uVar3,res_id,(OperandList *)local_b8);
  local_160._M_head_impl = pIVar5;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_138 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  IRContext::AddGlobalValue
            ((this->super_Pass).context_,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_160);
  pIVar5 = local_168;
  CopyDecorationsForNewVariable
            (this,var,idx,res_id,local_178,SUB41(local_174,0),is_old_var_struct,local_168);
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar1 = (this->super_Pass).context_;
  uVar3 = Instruction::result_id(var);
  IVar9 = IRContext::GetNames(pIVar1,uVar3);
  do {
    puVar2 = names_to_add.
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    assert_found_terminating_null = SUB81(pIVar5,0);
    local_198 = IVar9.end_._M_node;
    _Var7 = IVar9.begin_._M_node;
    d = names_to_add.
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    if (_Var7._M_node == local_198._M_node) {
      for (; d != puVar2; d = d + 1) {
        IRContext::AddDebug2Inst((this->super_Pass).context_,d);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ::~vector(&names_to_add);
      if (local_160._M_head_impl != (Instruction *)0x0) {
        (*((local_160._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      return res_id;
    }
    pOVar6 = Instruction::GetOperand((Instruction *)_Var7._M_node[1]._M_parent,1);
    utils::MakeString<spvtools::utils::SmallVector<unsigned_int,2ul>>
              (&name_str,(utils *)&pOVar6->words,(SmallVector<unsigned_int,_2UL> *)0x1,
               (bool)assert_found_terminating_null);
    if (local_170 == OpTypeArray) {
      utils::ToString<unsigned_int>((string *)local_b8,idx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     "[",(string *)local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     "]");
      std::__cxx11::string::append((string *)&name_str);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
LAB_004aea9e:
      std::__cxx11::string::_M_dispose();
    }
    else if (local_170 == OpTypeStruct) {
      pIVar1 = (this->super_Pass).context_;
      uVar3 = Instruction::result_id(local_168);
      pIVar5 = IRContext::GetMemberName(pIVar1,uVar3,idx);
      std::__cxx11::string::append((char *)&name_str);
      if (pIVar5 == (Instruction *)0x0) {
        utils::ToString<unsigned_int>((string *)local_138,idx);
      }
      else {
        pOVar6 = Instruction::GetOperand(pIVar5,2);
        utils::MakeString<spvtools::utils::SmallVector<unsigned_int,2ul>>
                  ((string *)local_138,(utils *)&pOVar6->words,(SmallVector<unsigned_int,_2UL> *)0x1
                   ,(bool)assert_found_terminating_null);
      }
      std::__cxx11::string::append((string *)&name_str);
      goto LAB_004aea9e;
    }
    this_01 = (Instruction *)::operator_new(0x70);
    pIVar1 = (this->super_Pass).context_;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_16c;
    local_16c = res_id;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_00);
    local_138._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_138 + 8),&local_90);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&name_str);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_b8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
    local_108[0] = 0xb;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_100,(SmallVector<unsigned_int,_2UL> *)local_b8);
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
               local_138,&local_d8);
    pIVar5 = (Instruction *)0x0;
    Instruction::Instruction(this_01,pIVar1,OpName,0,0,(OperandList *)&local_d8);
    local_180._M_head_impl = this_01;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8)
    ;
    lVar8 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_138 + lVar8));
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_b8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
    inst._M_head_impl = local_180._M_head_impl;
    pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstDefUse(pDVar4,inst._M_head_impl);
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                *)&names_to_add,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_180);
    if (local_180._M_head_impl != (Instruction *)0x0) {
      (*((local_180._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    std::__cxx11::string::_M_dispose();
    _Var7._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var7._M_node);
    IVar9.end_._M_node = local_198._M_node;
    IVar9.begin_._M_node = _Var7._M_node;
  } while( true );
}

Assistant:

uint32_t DescriptorScalarReplacement::CreateReplacementVariable(
    Instruction* var, uint32_t idx) {
  // The storage class for the new variable is the same as the original.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(var->GetSingleWordInOperand(0));

  // The type for the new variable will be a pointer to type of the elements of
  // the array.
  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable should be a pointer to an array or structure.");
  uint32_t pointee_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst = get_def_use_mgr()->GetDef(pointee_type_id);
  const bool is_array = pointee_type_inst->opcode() == spv::Op::OpTypeArray;
  const bool is_struct = pointee_type_inst->opcode() == spv::Op::OpTypeStruct;
  assert((is_array || is_struct) &&
         "Variable should be a pointer to an array or structure.");

  uint32_t element_type_id =
      is_array ? pointee_type_inst->GetSingleWordInOperand(0)
               : pointee_type_inst->GetSingleWordInOperand(idx);

  uint32_t ptr_element_type_id = context()->get_type_mgr()->FindPointerToType(
      element_type_id, storage_class);

  // Create the variable.
  uint32_t id = TakeNextId();
  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_element_type_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {static_cast<uint32_t>(storage_class)}}}));
  context()->AddGlobalValue(std::move(variable));

  CopyDecorationsForNewVariable(var, idx, id, ptr_element_type_id, is_array,
                                is_struct, pointee_type_inst);

  // Create a new OpName for the replacement variable.
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  for (auto p : context()->GetNames(var->result_id())) {
    Instruction* name_inst = p.second;
    std::string name_str = utils::MakeString(name_inst->GetOperand(1).words);
    if (is_array) {
      name_str += "[" + utils::ToString(idx) + "]";
    }
    if (is_struct) {
      Instruction* member_name_inst =
          context()->GetMemberName(pointee_type_inst->result_id(), idx);
      name_str += ".";
      if (member_name_inst)
        name_str += utils::MakeString(member_name_inst->GetOperand(2).words);
      else
        // In case the member does not have a name assigned to it, use the
        // member index.
        name_str += utils::ToString(idx);
    }

    std::unique_ptr<Instruction> new_name(new Instruction(
        context(), spv::Op::OpName, 0, 0,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {id}},
            {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}}));
    Instruction* new_name_inst = new_name.get();
    get_def_use_mgr()->AnalyzeInstDefUse(new_name_inst);
    names_to_add.push_back(std::move(new_name));
  }

  // We shouldn't add the new names when we are iterating over name ranges
  // above. We can add all the new names now.
  for (auto& new_name : names_to_add)
    context()->AddDebug2Inst(std::move(new_name));

  return id;
}